

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bstrncmp(bstring b0,bstring b1,int n)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *puVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar6 = -0x8000;
  if ((((b1 != (bstring)0x0 && b0 != (bstring)0x0) && (puVar4 = b0->data, puVar4 != (uchar *)0x0))
      && (puVar5 = b1->data, puVar5 != (uchar *)0x0)) &&
     ((uVar2 = b0->slen, -1 < (int)uVar2 && (uVar3 = b1->slen, -1 < (int)uVar3)))) {
    uVar7 = n;
    if ((int)uVar2 < n) {
      uVar7 = uVar2;
    }
    if ((int)uVar3 <= (int)uVar7) {
      uVar7 = uVar3;
    }
    if (puVar4 == puVar5) {
LAB_00114561:
      iVar6 = 0;
      if (uVar2 != uVar3 && uVar7 != n) {
        iVar6 = (uint)((int)uVar7 < (int)uVar2) * 2 + -1;
      }
    }
    else {
      uVar8 = 0;
      uVar9 = 0;
      if (0 < (int)uVar7) {
        uVar9 = (ulong)uVar7;
      }
      do {
        if (uVar9 == uVar8) goto LAB_00114561;
        puVar1 = puVar4 + uVar8;
        iVar6 = (int)(char)*puVar1 - (int)(char)puVar5[uVar8];
        if (iVar6 != 0) {
          return iVar6;
        }
        uVar8 = uVar8 + 1;
        iVar6 = 0;
      } while (*puVar1 != '\0');
    }
  }
  return iVar6;
}

Assistant:

int bstrncmp (const bstring b0, const bstring b1, int n) {
int i, v, m;

	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL ||
		b0->slen < 0 || b1->slen < 0) return SHRT_MIN;
	m = n;
	if (m > b0->slen) m = b0->slen;
	if (m > b1->slen) m = b1->slen;

	if (b0->data != b1->data) {
		for (i = 0; i < m; i ++) {
			v = ((char) b0->data[i]) - ((char) b1->data[i]);
			if (v != 0) return v;
			if (b0->data[i] == (unsigned char) '\0') return 0;
		}
	}

	if (n == m || b0->slen == b1->slen) return 0;

	if (b0->slen > m) return 1;
	return -1;
}